

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O3

IShaderResourceVariable * __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetStaticVariableByName
          (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this,SHADER_TYPE ShaderType,
          Char *Name)

{
  char cVar1;
  bool bVar2;
  Int32 IVar3;
  uint uVar4;
  ShaderVariableVkImpl *pSVar5;
  string _msg;
  Char *Name_local;
  char *local_30;
  Char *local_28;
  
  Name_local = Name;
  bVar2 = IsConsistentShaderType(ShaderType,this->m_PipelineType);
  if (bVar2) {
    IVar3 = GetShaderTypePipelineIndex(ShaderType,this->m_PipelineType);
    cVar1 = (this->m_StaticResStageIndex)._M_elems[IVar3];
    if (-1 < cVar1) {
      uVar4 = this->m_StaticResShaderStages - (this->m_StaticResShaderStages >> 1 & 0x55555555);
      uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333);
      uVar4 = (uVar4 >> 4) + uVar4 & 0xf0f0f0f;
      if (uVar4 * 0x1010101 >> 0x18 <= (uint)(int)cVar1) {
        FormatString<char[26],char[58]>
                  (&_msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"static_cast<Uint32>(VarMngrInd) < GetNumStaticResStages()",
                   (char (*) [58])(ulong)uVar4);
        DebugAssertionFailed
                  (_msg._M_dataplus._M_p,"GetStaticVariableByName",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
                   ,0x1dd);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_msg._M_dataplus._M_p != &_msg.field_2) {
          operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
        }
      }
      pSVar5 = ShaderVariableManagerVk::GetVariable(this->m_StaticVarsMgrs + (uint)(int)cVar1,Name);
      return (IShaderResourceVariable *)pSVar5;
    }
  }
  else {
    local_28 = GetShaderTypeLiteralName(ShaderType);
    local_30 = GetPipelineTypeString(this->m_PipelineType);
    FormatString<char[33],char_const*,char[19],char_const*,char[30],char_const*,char[31],char_const*,char[3]>
              (&_msg,(Diligent *)"Unable to find static variable \'",(char (*) [33])&Name_local,
               (char **)"\' in shader stage ",(char (*) [19])&local_28,
               (char **)" as the stage is invalid for ",(char (*) [30])&local_30,(char **)0x756aa4,
               (char (*) [31])
               &(this->
                super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                ).m_Desc,(char **)"\'.",(char (*) [3])_msg._M_dataplus._M_p);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(1,_msg._M_dataplus._M_p,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_msg._M_dataplus._M_p != &_msg.field_2) {
      operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
    }
  }
  return (IShaderResourceVariable *)0x0;
}

Assistant:

GetStaticVariableByName(SHADER_TYPE ShaderType,
                                                                                const Char* Name) override final
    {
        if (!IsConsistentShaderType(ShaderType, m_PipelineType))
        {
            LOG_WARNING_MESSAGE("Unable to find static variable '", Name, "' in shader stage ", GetShaderTypeLiteralName(ShaderType),
                                " as the stage is invalid for ", GetPipelineTypeString(m_PipelineType), " pipeline resource signature '", this->m_Desc.Name, "'.");
            return nullptr;
        }

        const Int32 ShaderTypeInd = GetShaderTypePipelineIndex(ShaderType, m_PipelineType);
        const int   VarMngrInd    = m_StaticResStageIndex[ShaderTypeInd];
        if (VarMngrInd < 0)
            return nullptr;

        VERIFY_EXPR(static_cast<Uint32>(VarMngrInd) < GetNumStaticResStages());
        return m_StaticVarsMgrs[VarMngrInd].GetVariable(Name);
    }